

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secant.c
# Opt level: O1

int bfgs_l_min(custom_function *funcpt,custom_gradient *funcgrad,double *xi,int N,int m,double *dx,
              double fsval,double maxstep,int MAXITER,int *niter,double eps,double gtol,double ftol,
              double xtol,double *xf)

{
  undefined8 uVar1;
  double *jac;
  int iVar2;
  undefined4 in_register_0000000c;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  double *pdVar6;
  long lVar7;
  double *pdVar8;
  size_t __size;
  size_t sVar9;
  uint N_00;
  uint uVar10;
  undefined4 in_XMM0_Dc;
  undefined4 extraout_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 extraout_XMM0_Dd;
  double dVar11;
  double dVar12;
  double local_158;
  double alpha;
  double *local_148;
  double *local_140;
  double *local_138;
  double *local_130;
  double local_128;
  undefined8 uStack_120;
  double local_118;
  double *local_110;
  double local_108;
  custom_gradient *local_100;
  size_t local_f8;
  double *local_f0;
  undefined1 local_e8 [16];
  int local_d4;
  double local_d0;
  double fxf;
  ulong local_c0;
  void *local_b8;
  custom_function *local_b0;
  double *local_a8;
  double local_a0;
  long local_98;
  double *local_90;
  undefined1 local_88 [16];
  double *local_78;
  double *local_70;
  double *local_68;
  double *local_60;
  double *local_58;
  ulong local_50;
  double local_48;
  double *local_40;
  int local_34;
  
  local_50 = CONCAT44(in_register_0000000c,N);
  local_e8._8_4_ = in_XMM0_Dc;
  local_e8._0_8_ = fsval;
  local_e8._12_4_ = in_XMM0_Dd;
  lVar7 = (long)N;
  sVar9 = lVar7 * 8;
  alpha = xtol;
  local_118 = ftol;
  local_108 = eps;
  local_100 = funcgrad;
  fxf = gtol;
  local_b0 = funcpt;
  local_48 = maxstep;
  local_58 = (double *)malloc(sVar9);
  local_90 = (double *)malloc(sVar9);
  local_a8 = (double *)malloc(sVar9);
  local_78 = (double *)malloc(sVar9);
  local_110 = (double *)malloc(sVar9 * lVar7);
  local_b8 = malloc(sVar9);
  __size = m * lVar7 * 8;
  local_c0 = (ulong)(uint)m;
  local_98 = lVar7;
  local_70 = (double *)malloc(__size);
  local_68 = (double *)malloc(__size);
  local_40 = (double *)malloc(sVar9);
  local_60 = (double *)malloc(sVar9);
  *niter = 0;
  if (local_108 < 0.0) {
    local_a0 = sqrt(local_108);
  }
  else {
    local_a0 = SQRT(local_108);
  }
  uVar4 = local_50;
  pdVar6 = local_58;
  pdVar8 = local_90;
  local_158 = 1.0;
  N_00 = (uint)local_50;
  if (0 < (int)N_00) {
    uVar3 = 0;
    do {
      xi[uVar3] = dx[uVar3] * xi[uVar3];
      dx[uVar3] = 1.0 / dx[uVar3];
      uVar3 = uVar3 + 1;
    } while ((local_50 & 0xffffffff) != uVar3);
  }
  local_128 = (*local_b0->funcpt)(xi,N_00,local_b0->params);
  uStack_120 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
  uVar3 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc) & 0x7fffffffffffffff;
  local_34 = 0;
  local_88._8_4_ = (int)uVar3;
  local_88._0_8_ = ABS(local_128);
  local_88._12_4_ = (int)(uVar3 >> 0x20);
  if (1.79769313486232e+308 <= ABS(local_128)) {
    printf("Program Exiting as the function value exceeds the maximum double value");
    local_34 = 0xf;
  }
  if (NAN(local_128)) {
    printf("Program Exiting as the function returns NaN");
    local_34 = 0xf;
  }
  iVar2 = grad_fd(local_b0,local_100,xi,N_00,dx,local_a0,pdVar6);
  if (iVar2 == 0xf) {
    local_34 = 0xf;
  }
  if (local_48 <= 0.0) {
    dVar12 = 0.0;
    local_48 = 0.0;
    if (0 < (int)N_00) {
      uVar3 = 0;
      dVar12 = 0.0;
      do {
        dVar11 = dx[uVar3];
        dVar12 = dVar12 + dVar11 * dVar11;
        local_48 = local_48 + dVar11 * xi[uVar3] * dVar11 * xi[uVar3];
        uVar3 = uVar3 + 1;
      } while ((uVar4 & 0xffffffff) != uVar3);
    }
    if (dVar12 < 0.0) {
      dVar12 = sqrt(dVar12);
    }
    else {
      dVar12 = SQRT(dVar12);
    }
    if (local_48 < 0.0) {
      dVar11 = local_48;
      local_48 = dVar12;
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(local_48);
      local_48 = dVar12;
    }
    if (local_48 <= dVar11) {
      local_48 = dVar11 * 1000.0;
    }
    else {
      local_48 = local_48 * 1000.0;
    }
  }
  if (0 < (int)N_00) {
    dVar12 = (double)local_88._0_8_;
    if ((double)local_88._0_8_ <= ABS((double)local_e8._0_8_)) {
      dVar12 = ABS((double)local_e8._0_8_);
    }
    uVar3 = 0;
    do {
      dVar11 = ABS(xi[uVar3]);
      if (ABS(xi[uVar3]) <= 1.0 / ABS(dx[uVar3])) {
        dVar11 = 1.0 / ABS(dx[uVar3]);
      }
      pdVar8[uVar3] = (ABS(pdVar6[uVar3]) * dVar11) / dVar12;
      uVar3 = uVar3 + 1;
    } while ((uVar4 & 0xffffffff) != uVar3);
  }
  dVar12 = array_max_abs(pdVar8,N_00);
  if ((dVar12 <= fxf * 0.001) && (local_34 = 1, 0 < (int)N_00)) {
    uVar3 = 0;
    do {
      xf[uVar3] = xi[uVar3];
      uVar3 = uVar3 + 1;
    } while ((uVar4 & 0xffffffff) != uVar3);
  }
  if (0 < (int)N_00) {
    memcpy(local_a8,xi,(uVar4 & 0xffffffff) << 3);
  }
  local_d0 = local_128;
  if (0 < (int)N_00) {
    sVar9 = (uVar4 & 0xffffffff) << 3;
    memset(local_40,0,sVar9);
    pdVar6 = local_58;
    memset(local_60,0,sVar9);
  }
  if (local_34 == 0) {
    local_88._0_8_ = dx;
    uVar10 = ((int)local_c0 + -1) * N_00;
    local_d4 = (int)local_c0 * N_00;
    local_e8._0_8_ = (uVar4 & 0xffffffff) * 8;
    local_138 = local_70 + (int)uVar10;
    local_f8 = (ulong)(N_00 - 1) * 8 + 8;
    local_130 = local_68 + (int)uVar10;
    local_148 = local_70 + local_98;
    local_140 = local_68 + local_98;
    local_f0 = xi;
    do {
      pdVar8 = local_110;
      iVar2 = *niter;
      if (MAXITER <= iVar2) {
        local_34 = 4;
        break;
      }
      iVar5 = (int)local_50;
      inithess_l(local_110,iVar5,iVar2,local_40,local_60,(double *)local_88._0_8_);
      jac = local_58;
      pdVar6 = local_78;
      bfgs_rec(pdVar8,iVar5,iVar2,(int)local_c0,local_58,local_70,local_68,local_78);
      scale(pdVar6,1,iVar5,-1.0);
      if (0 < iVar5) {
        memcpy(local_b8,jac,local_e8._0_8_);
      }
      pdVar8 = local_a8;
      uVar1 = local_88._0_8_;
      iVar5 = (int)local_50;
      iVar2 = lnsrchmt(local_b0,local_100,local_a8,&local_d0,jac,&local_158,local_78,iVar5,
                       (double *)local_88._0_8_,local_48,MAXITER,local_a0,local_118,fxf,alpha,xf);
      pdVar6 = local_58;
      local_34 = stopcheck2_mt(local_d0,iVar5,local_128,local_58,(double *)uVar1,local_108,fxf,
                               local_118,iVar2);
      local_128 = local_d0;
      uStack_120 = 0;
      if (0 < iVar5) {
        uVar3 = 0;
        do {
          dVar12 = pdVar6[uVar3];
          dVar11 = *(double *)((long)local_b8 + uVar3 * 8);
          local_40[uVar3] = xf[uVar3] - pdVar8[uVar3];
          local_60[uVar3] = dVar12 - dVar11;
          uVar3 = uVar3 + 1;
        } while ((uVar4 & 0xffffffff) != uVar3);
      }
      iVar2 = *niter;
      iVar5 = (int)local_50;
      if (iVar2 < (int)local_c0) {
        if (0 < iVar5) {
          local_98 = (long)(iVar2 * iVar5);
          memcpy(local_70 + local_98,local_40,local_e8._0_8_);
          sVar9 = local_e8._0_8_;
          pdVar6 = local_68 + local_98;
LAB_00130088:
          memcpy(pdVar6,local_60,sVar9);
        }
      }
      else {
        if (0 < (int)uVar10) {
          uVar3 = 0;
          do {
            local_70[uVar3] = local_148[uVar3];
            local_68[uVar3] = local_140[uVar3];
            uVar3 = uVar3 + 1;
          } while (uVar10 != uVar3);
        }
        if ((int)uVar10 < local_d4) {
          memcpy(local_138,local_40,local_f8);
          sVar9 = local_f8;
          pdVar6 = local_130;
          goto LAB_00130088;
        }
      }
      if (0 < iVar5) {
        uVar1 = local_e8._0_8_;
        memset(local_78,0,local_e8._0_8_);
        memcpy(pdVar8,xf,uVar1);
      }
      *niter = iVar2 + 1;
    } while (local_34 == 0);
    N_00 = (uint)local_50;
    dx = (double *)local_88._0_8_;
    xi = local_f0;
    pdVar8 = local_90;
    pdVar6 = local_58;
  }
  if (0 < (int)N_00) {
    uVar4 = 0;
    do {
      xi[uVar4] = dx[uVar4] * xi[uVar4];
      dx[uVar4] = 1.0 / dx[uVar4];
      uVar4 = uVar4 + 1;
    } while (N_00 != uVar4);
  }
  free(pdVar6);
  free(pdVar8);
  free(local_a8);
  free(local_110);
  free(local_78);
  free(local_b8);
  free(local_70);
  free(local_68);
  free(local_40);
  free(local_60);
  return local_34;
}

Assistant:

int bfgs_l_min(custom_function *funcpt, custom_gradient *funcgrad, double *xi, int N, int m, double *dx, double fsval,double maxstep, int MAXITER, int *niter,
		double eps,double gtol,double ftol,double xtol,double *xf)  {
	int rcode,gfdcode;
	int i,j,siter,retval;
	int ptr,iter;
	double dt1,dt2,alpha,fo;
	double fx,num,den,stop0,fxf,eps2;
	double *jac,*scheck,*xc,*H,*step,*jacf,*sk,*yk,*tsk,*tyk;

	jac = (double*) malloc(sizeof(double) *N);
	scheck = (double*) malloc(sizeof(double) *N);
	xc = (double*) malloc(sizeof(double) *N);
	step = (double*) malloc(sizeof(double) *N);
	H = (double*) malloc(sizeof(double) *N * N);
	jacf = (double*) malloc(sizeof(double) *N);
	sk = (double*) malloc(sizeof(double) * m * N);
	yk = (double*) malloc(sizeof(double) * m * N);
	tsk = (double*) malloc(sizeof(double) *N);
	tyk = (double*) malloc(sizeof(double) *N);

	/*
	 * Return Codes
	 *
	 * Codes 1,2,3 denote possible success.
	 * Codes 0 and 4 denote failure.
	 *
	 * 1 - df(x)/dx <= gtol achieved so xf may be the local minima.
	 * 2 - Distance between the last two steps is less than stol or |xf - xi| <= stol so xf may be the local minima.
	 * 3 - Global Step failed to locate a lower point than xi so xi may be the local minima.
	 * 4 - Iteration Limit exceeded. Convergence not achieved.
	 *
	 */

	rcode = 0;
	*niter = 0;
	siter = MAXITER;
	eps2 = sqrt(eps);

	alpha = 1.0;
	gfdcode = 0;
	
	//set values
	for(i = 0; i < N;++i) {
		xi[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}
	fx = FUNCPT_EVAL(funcpt, xi, N);
	if (fx >= DBL_MAX || fx <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		rcode = 15;
	}
	if (fx != fx) {
		printf("Program Exiting as the function returns NaN");
		rcode = 15;
	}
	fo = fx;

	gfdcode = grad_fd(funcpt,funcgrad,xi,N,dx,eps2,jac);
	if (gfdcode == 15) {
		rcode = 15;
	}

	if (maxstep <= 0.0) {
		maxstep = 1000.0;
		dt1 = dt2 = 0.0;
		for (i = 0; i < N; ++i) {
			dt1 += dx[i] * dx[i];
			dt2 += dx[i] * xi[i] * dx[i] * xi[i];
		}

		dt1 = sqrt(dt1);
		dt2 = sqrt(dt2);

		if (dt1 > dt2) {
			maxstep *= dt1;
		}
		else {
			maxstep *= dt2;
		}
	}


	//Check Stop0
	if (fabs(fx) > fabs(fsval)) {
			den = fabs(fx);
	} else {
			den = fabs(fsval);
	}
	for(i = 0; i < N;++i) {
		if (fabs(xi[i]) > 1.0 / fabs(dx[i])) {
			num = fabs(xi[i]);
		} else {
			num = 1.0 / fabs(dx[i]);
		}
		scheck[i] = fabs(jac[i]) * num / den;
	}

	stop0 = array_max_abs(scheck,N);

	if (stop0 <= gtol * 1e-03) {
		rcode = 1;
		for(i = 0; i < N;++i) {
			xf[i] = xi[i];
		}
	}

	//hessian_fd(funcpt,xi,N,dx,hess);
	//inithess_lower(L,N,fx,fsval,dx);

	for(i = 0; i < N;++i) {
		xc[i] = xi[i];
	}
	fxf = fx;

	for (i = 0; i < N; ++i) {
		tsk[i] = 0.0;
		tyk[i] = 0.0;
	}


	while (rcode == 0 && *niter < siter) {
		iter = *niter;
		inithess_l(H,N,iter,tsk,tyk,dx);

		bfgs_rec(H,N,iter,m,jac,sk,yk,step);
		//mdisplay(step,1,N);

		scale(step,1,N,-1.0);

		for (i = 0; i < N; ++i) {
			jacf[i] = jac[i];
		}

		//linsolve_lower(L,N,jac,step);

		//scale(jac,1,N,-1.0);
		//retval = lnsrchmod(funcpt,xc,jac,step,N,dx,maxstep,stol,xf,jacf);
		retval = lnsrchmt(funcpt,funcgrad, xc, &fxf, jac, &alpha, step, N, dx, maxstep,MAXITER,eps2,ftol, gtol, xtol, xf);
		//retval = lnsrch(funcpt,xc,jac,step,N,dx,maxstep,stol,xf);

		//retval = swolfe(funcpt,xc,jac,step,N,dx,maxstep,stol,xf);
		//printf("%g %g \n",fo,fxf);

		//grad_fd(funcpt,xf,N,dx,jacf);
		//rcode = stopcheck_mt(fxf, N, xc, xf, jac, dx, fsval, gtol, ftol, retval);
		rcode = stopcheck2_mt(fxf,N,fo,jac,dx,eps,gtol,ftol,retval);
		//rcode = stopcheck3_mt(xc,xf,fxf,N,fo,jac,dx,eps,gtol,ftol,retval);
		//printf("\n CODE %d", rcode);
		fo = fxf;
		for (i = 0; i < N;++i) {
			tsk[i] = xf[i] - xc[i];
			tyk[i] = jac[i] - jacf[i];
		}

		if (*niter >= m) {
			for (i = 0; i < (m-1) * N; ++i) {
				sk[i] = sk[N + i];
				yk[i] = yk[N + i];
			}
			j = 0;

			for (i = (m - 1) * N; i < m * N; ++i) {
				sk[i] = tsk[j];
				yk[i] = tyk[j];
				j++;
			}

		} else {
			ptr = *niter * N;

			for (i = 0; i < N;++i) {
				sk[ptr + i] = tsk[i];
				yk[ptr + i] = tyk[i];
			}

		}

		
		for(i = 0; i < N;++i) {
			xc[i] = xf[i];
			step[i] = 0.0;
		}
		*niter = *niter + 1;

	}

	//mdisplay(xc, 1, N);

	if (rcode == 0 && *niter >= siter) {
		rcode = 4;
	}
	
	for(i = 0; i < N;++i) {
		xi[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}
	


	free(jac);
	free(scheck);
	free(xc);
	free(H);
	free(step);
	free(jacf);
	free(sk);
	free(yk);
	free(tsk);
	free(tyk);
	return rcode;
}